

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmGeneratorTarget::MaybeGetLocation
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  ulong uVar1;
  string local_60;
  ImportInfo *local_30;
  ImportInfo *imp;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *location;
  
  imp._7_1_ = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(__return_storage_ptr__);
  local_30 = GetImportInfo(this,local_20);
  if (local_30 == (ImportInfo *)0x0) {
    GetFullPath(&local_60,this,local_20,RuntimeBinaryArtifact,false);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_30->Location);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmGeneratorTarget::MaybeGetLocation(
  std::string const& config) const
{
  cm::optional<std::string> location;
  if (cmGeneratorTarget::ImportInfo const* imp = this->GetImportInfo(config)) {
    if (!imp->Location.empty()) {
      location = imp->Location;
    }
  } else {
    location = this->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  }
  return location;
}